

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseMessageSetItem
          (ExtensionSet *this,CodedInputStream *input,ExtensionFinder *extension_finder,
          FieldSkipper *field_skipper)

{
  uint8 uVar1;
  uint8 *puVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  byte unaff_BPL;
  uint32 tag;
  uint32 length;
  string message_data;
  string temp;
  CodedOutputStream coded_output;
  StringOutputStream output_stream;
  uint32 local_dc;
  ExtensionFinder *local_d8;
  string local_d0;
  undefined1 local_b0 [28];
  undefined8 local_94;
  undefined2 local_8c;
  int local_88;
  undefined8 local_84;
  undefined8 uStack_7c;
  int local_74;
  DescriptorPool *local_70;
  MessageFactory *pMStack_68;
  CodedOutputStream local_60;
  StringOutputStream local_40;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  tag = 0;
  local_d8 = extension_finder;
  do {
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (uVar6 = (uint)(char)*puVar2, -1 < (int)uVar6)) {
      input->last_tag_ = uVar6;
      input->buffer_ = puVar2 + 1;
    }
    else {
      uVar6 = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = uVar6;
    }
    if ((int)uVar6 < 0x10) {
      if (uVar6 == 0) {
LAB_0020b69e:
        unaff_BPL = 0;
      }
      else {
        if (uVar6 != 0xc) {
LAB_0020b688:
          iVar7 = (*field_skipper->_vptr_FieldSkipper[2])(field_skipper,input,(ulong)uVar6);
          cVar4 = (char)iVar7;
LAB_0020b696:
          if (cVar4 == '\0') goto LAB_0020b69e;
LAB_0020b89e:
          bVar5 = true;
          goto LAB_0020b8a0;
        }
        unaff_BPL = 1;
      }
      bVar5 = false;
    }
    else if (uVar6 == 0x10) {
      puVar2 = input->buffer_;
      if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
        input->buffer_ = puVar2 + 1;
        local_60.output_._0_4_ = (int)(char)uVar1;
LAB_0020b6db:
        tag = (int)local_60.output_ * 8 + 2;
        if (local_d0._M_string_length == 0) {
          bVar5 = true;
        }
        else {
          local_b0._0_8_ = (ZeroCopyInputStream *)0x0;
          local_b0._8_8_ = local_d0._M_dataplus._M_p;
          local_b0._24_4_ = (undefined4)local_d0._M_string_length;
          local_b0._16_8_ = local_d0._M_dataplus._M_p + (int)local_b0._24_4_;
          local_94._0_4_ = 0;
          local_94._4_4_ = 0;
          local_8c._0_1_ = false;
          local_8c._1_1_ = false;
          local_84._0_4_ = 0;
          local_84._4_4_ = 0x4000000;
          uStack_7c._0_4_ = 0x2000000;
          uStack_7c._4_4_ = 0;
          local_74 = io::CodedInputStream::default_recursion_limit_;
          local_70 = (DescriptorPool *)0x0;
          pMStack_68 = (MessageFactory *)0x0;
          local_88 = local_b0._24_4_;
          bVar5 = ParseField(this,tag,(CodedInputStream *)local_b0,local_d8,field_skipper);
          if (bVar5) {
            local_d0._M_string_length = 0;
            *local_d0._M_dataplus._M_p = '\0';
          }
          else {
            unaff_BPL = 0;
          }
          io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_b0);
        }
      }
      else {
        bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,(uint32 *)&local_60);
        if (bVar5) goto LAB_0020b6db;
        unaff_BPL = 0;
        bVar5 = false;
      }
      if (bVar5 != false) goto LAB_0020b89e;
      bVar5 = false;
    }
    else {
      if (uVar6 != 0x1a) goto LAB_0020b688;
      if (tag != 0) {
        cVar4 = ParseField(this,tag,input,local_d8,field_skipper);
        goto LAB_0020b696;
      }
      local_b0._0_8_ = local_b0 + 0x10;
      local_b0._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_b0._16_8_ = local_b0._16_8_ & 0xffffffffffffff00;
      puVar2 = input->buffer_;
      if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
        input->buffer_ = puVar2 + 1;
        local_dc = (int)(char)uVar1;
LAB_0020b7fc:
        bVar5 = io::CodedInputStream::ReadString(input,(string *)local_b0,local_dc);
        if (!bVar5) goto LAB_0020b868;
        io::StringOutputStream::StringOutputStream(&local_40,&local_d0);
        io::CodedOutputStream::CodedOutputStream(&local_60,&local_40.super_ZeroCopyOutputStream);
        io::CodedOutputStream::WriteVarint32(&local_60,local_dc);
        io::CodedOutputStream::WriteRaw(&local_60,(void *)local_b0._0_8_,local_b0._8_4_);
        io::CodedOutputStream::~CodedOutputStream(&local_60);
        io::StringOutputStream::~StringOutputStream(&local_40);
        bVar3 = true;
      }
      else {
        bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_dc);
        if (bVar5) goto LAB_0020b7fc;
LAB_0020b868:
        unaff_BPL = 0;
        bVar3 = false;
      }
      if ((ZeroCopyInputStream *)local_b0._0_8_ != (ZeroCopyInputStream *)(local_b0 + 0x10)) {
        operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1));
      }
      tag = 0;
      bVar5 = false;
      if (bVar3) goto LAB_0020b89e;
    }
LAB_0020b8a0:
    if (!bVar5) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,
                        CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                 local_d0.field_2._M_local_buf[0]) + 1);
      }
      return (bool)(unaff_BPL & 1);
    }
  } while( true );
}

Assistant:

bool ExtensionSet::ParseMessageSetItem(io::CodedInputStream* input,
                                       ExtensionFinder* extension_finder,
                                       FieldSkipper* field_skipper) {
  // TODO(kenton):  It would be nice to share code between this and
  // WireFormatLite::ParseAndMergeMessageSetItem(), but I think the
  // differences would be hard to factor out.

  // This method parses a group which should contain two fields:
  //   required int32 type_id = 2;
  //   required data message = 3;

  // Once we see a type_id, we'll construct a fake tag for this extension
  // which is the tag it would have had under the proto2 extensions wire
  // format.
  uint32 fake_tag = 0;

  // If we see message data before the type_id, we'll append it to this so
  // we can parse it later.
  string message_data;

  while (true) {
    uint32 tag = input->ReadTag();
    if (tag == 0) return false;

    switch (tag) {
      case WireFormatLite::kMessageSetTypeIdTag: {
        uint32 type_id;
        if (!input->ReadVarint32(&type_id)) return false;
        fake_tag = WireFormatLite::MakeTag(type_id,
            WireFormatLite::WIRETYPE_LENGTH_DELIMITED);

        if (!message_data.empty()) {
          // We saw some message data before the type_id.  Have to parse it
          // now.
          io::CodedInputStream sub_input(
              reinterpret_cast<const uint8*>(message_data.data()),
              message_data.size());
          if (!ParseFieldMaybeLazily(fake_tag, &sub_input,
                                     extension_finder, field_skipper)) {
            return false;
          }
          message_data.clear();
        }

        break;
      }

      case WireFormatLite::kMessageSetMessageTag: {
        if (fake_tag == 0) {
          // We haven't seen a type_id yet.  Append this data to message_data.
          string temp;
          uint32 length;
          if (!input->ReadVarint32(&length)) return false;
          if (!input->ReadString(&temp, length)) return false;
          io::StringOutputStream output_stream(&message_data);
          io::CodedOutputStream coded_output(&output_stream);
          coded_output.WriteVarint32(length);
          coded_output.WriteString(temp);
        } else {
          // Already saw type_id, so we can parse this directly.
          if (!ParseFieldMaybeLazily(fake_tag, input,
                                     extension_finder, field_skipper)) {
            return false;
          }
        }

        break;
      }

      case WireFormatLite::kMessageSetItemEndTag: {
        return true;
      }

      default: {
        if (!field_skipper->SkipField(input, tag)) return false;
      }
    }
  }
}